

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O1

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          shared_ptr<nuraft::buffer> *result,shared_ptr<std::exception> *err,cmd_result_code code)

{
  _Manager_type p_Var1;
  _Manager_type p_Var2;
  int iVar3;
  
  this->code_ = code;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar3 == 0) {
    (this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (result->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(result->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              );
    (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    this->has_result_ = true;
    p_Var1 = (this->handler2_).super__Function_base._M_manager;
    p_Var2 = (this->handler_).super__Function_base._M_manager;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    if (p_Var2 != (_Manager_type)0x0 || p_Var1 != (_Manager_type)0x0) {
      if ((this->handler2_).super__Function_base._M_manager == (_Manager_type)0x0) {
        if ((this->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->handler_)._M_invoker)((_Any_data *)&this->handler_,result,err);
        }
      }
      else {
        (*(this->handler2_)._M_invoker)((_Any_data *)&this->handler2_,this,err);
      }
    }
    std::condition_variable::notify_all();
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void set_result(T& result, TE& err, cmd_result_code code = cmd_result_code::OK) {
        bool call_handler = false;
        code_ = code;
        {   std::lock_guard<std::mutex> guard(lock_);
            result_ = result;
            err_ = err;
            has_result_ = true;
            if (handler_ || handler2_) call_handler = true;
        }
        if (call_handler) {
            if (handler2_) handler2_(*this, err);
            else if (handler_) handler_(result, err);
        }
        cv_.notify_all();
    }